

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

void __thiscall
cnn::FoldRows::backward_impl
          (FoldRows *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint i_1;
  ulong i_00;
  uint j;
  uint uVar2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_110;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_f0;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>>
  local_d0 [80];
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>
  local_80 [80];
  
  uVar1 = (fx->d).d[0];
  Tensor::operator*(&local_110,dEdf);
  Tensor::operator*(&local_f0,dEdxi);
  for (i_00 = 0; i_00 != uVar1; i_00 = i_00 + 1) {
    for (uVar2 = 0; uVar2 < this->nrows; uVar2 = uVar2 + 1) {
      Eigen::
      Block<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
      ::Block((Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
               *)local_80,&local_110,i_00);
      Eigen::
      Block<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
      ::Block((Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
               *)local_d0,&local_f0,(ulong)(this->nrows * (int)i_00 + uVar2));
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,1,-1,false>>
      ::operator+=(local_d0,local_80);
    }
  }
  return;
}

Assistant:

void FoldRows::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("AddVectorToAllColumns::backward not implemented for CUDA");
#else
  unsigned orows = fx.d.rows();
  auto d = *dEdf;
  auto di = *dEdxi;
  for (unsigned i = 0; i < orows; ++i)
    for (unsigned j = 0; j < nrows; ++j)
      di.row(i * nrows + j) += d.row(i);
#endif
}